

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_filter.cc
# Opt level: O3

void __thiscall sptk::reaper::FdFilter::FilterBuffer(FdFilter *this,int n_input,int *n_output)

{
  short sVar1;
  int iVar2;
  int16_t *piVar3;
  int iVar4;
  short *psVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  float *pfVar11;
  int iVar12;
  short *psVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  long lVar18;
  long lVar19;
  int *piVar20;
  short *psVar21;
  int iVar22;
  float fVar23;
  float fVar24;
  
  uVar8 = this->filter_state_;
  if ((uVar8 & 1) == 0) {
    iVar22 = this->left_over_;
  }
  else {
    this->to_skip_ = 0;
    this->left_over_ = 0;
    this->first_out_ = 0;
    iVar4 = this->n_filter_coeffs_ + this->max_input_;
    if (iVar4 == 0) {
      iVar22 = 0;
    }
    else {
      iVar22 = 0;
      memset(this->output_delayed_,0,(ulong)(iVar4 - 1) * 4 + 4);
    }
  }
  uVar6 = iVar22 + n_input;
  iVar4 = this->fft_size_;
  iVar12 = (int)uVar6 / iVar4;
  psVar5 = this->input_buffer_;
  psVar13 = this->leftovers_;
  if (((uVar8 & 2) == 0) || (iVar12 != 0)) {
    psVar21 = psVar5;
    if (iVar4 != iVar22) {
      lVar10 = 0;
      do {
        sVar1 = *psVar21;
        psVar21 = psVar21 + 1;
        psVar13[iVar22 + lVar10] = sVar1;
        lVar10 = lVar10 + 1;
      } while (iVar4 - iVar22 != (int)lVar10);
    }
    if (iVar12 == 0) {
      if ((uVar8 & 2) == 0) {
        this->left_over_ = uVar6;
        *n_output = 0;
        this->first_out_ = this->first_out_ | this->filter_state_ & 1U;
        return;
      }
      this->filter_state_ = uVar8 | this->first_out_;
      this->first_out_ = 0;
      pfVar17 = this->output_delayed_;
      iVar12 = 0;
      goto LAB_00113414;
    }
    this->filter_state_ = uVar8 | this->first_out_;
    this->first_out_ = 0;
    pfVar17 = this->output_delayed_;
    if (iVar12 < 1) goto LAB_00113414;
  }
  else {
    psVar13 = psVar13 + iVar22;
    if (n_input != 0) {
      lVar10 = 0;
      lVar18 = 0;
      do {
        psVar13[lVar18] = psVar5[lVar18];
        lVar18 = lVar18 + 1;
        lVar10 = lVar10 + -2;
      } while (n_input != (int)lVar18);
      psVar5 = (short *)((long)psVar5 - lVar10);
      psVar13 = (short *)((long)psVar13 - lVar10);
    }
    if ((int)uVar6 < iVar4) {
      memset(psVar13,0,(ulong)(iVar4 + ~uVar6) * 2 + 2);
    }
    this->filter_state_ = uVar8 | this->first_out_;
    this->first_out_ = 0;
    pfVar17 = this->output_delayed_;
    iVar12 = 1;
    psVar21 = psVar5;
  }
  iVar22 = 0;
  do {
    iVar4 = this->fft_size_by2_;
    if (iVar22 == 0) {
      pfVar15 = this->x_;
      pfVar11 = this->y_;
      if (iVar4 != 0) {
        piVar3 = this->leftovers_;
        lVar10 = 0;
        lVar18 = 0;
        do {
          pfVar15[lVar18] = (float)(int)piVar3[lVar18];
          pfVar11[lVar18] = (float)(int)piVar3[iVar4 + lVar18];
          lVar18 = lVar18 + 1;
          lVar10 = lVar10 + -4;
        } while (iVar4 != (int)lVar18);
        pfVar14 = (float *)((long)pfVar11 - lVar10);
        pfVar16 = (float *)((long)pfVar15 - lVar10);
        goto LAB_00113270;
      }
    }
    else {
      pfVar15 = this->x_;
      pfVar11 = this->y_;
      pfVar14 = pfVar11;
      pfVar16 = pfVar15;
      if (iVar4 != 0) {
        lVar18 = 0;
        lVar10 = 0;
        do {
          pfVar15[lVar10] = (float)(int)*psVar21;
          psVar13 = psVar21 + iVar4;
          psVar21 = psVar21 + 1;
          pfVar11[lVar10] = (float)(int)*psVar13;
          lVar10 = lVar10 + 1;
          lVar18 = lVar18 + -4;
        } while (iVar4 != (int)lVar10);
        pfVar14 = (float *)((long)pfVar11 - lVar18);
        pfVar16 = (float *)((long)pfVar15 - lVar18);
      }
      psVar21 = psVar21 + iVar4;
LAB_00113270:
      if (iVar4 != 0) {
        lVar10 = 0;
        do {
          pfVar14[lVar10] = 0.0;
          pfVar16[lVar10] = 0.0;
          lVar10 = lVar10 + 1;
        } while (iVar4 != (int)lVar10);
      }
    }
    FFT::fft(this->fft_,pfVar15,pfVar11);
    iVar4 = this->fft_size_;
    pfVar15 = this->x_;
    pfVar11 = this->y_;
    if (iVar4 != 0) {
      pfVar14 = this->xf_;
      lVar10 = 0;
      do {
        fVar23 = pfVar14[lVar10];
        fVar24 = pfVar15[lVar10];
        pfVar11[lVar10] = fVar23 * pfVar11[lVar10];
        pfVar15[lVar10] = fVar24 * fVar23;
        lVar10 = lVar10 + 1;
      } while (iVar4 != (int)lVar10);
    }
    FFT::ifft(this->fft_,pfVar15,pfVar11);
    iVar4 = this->fft_size_;
    lVar10 = (long)iVar4;
    iVar7 = this->n_filter_coeffs_by2_;
    lVar18 = (long)iVar7;
    iVar9 = iVar4 - iVar7;
    pfVar15 = pfVar17;
    if (0 < lVar18) {
      pfVar11 = this->x_;
      lVar19 = (long)iVar9;
      do {
        *pfVar15 = pfVar11[lVar19] + *pfVar15;
        pfVar15 = pfVar15 + 1;
        lVar19 = lVar19 + 1;
      } while (lVar19 < lVar10);
      if (0 < iVar7) {
        pfVar11 = this->x_;
        lVar19 = 0;
        do {
          *(float *)((long)pfVar15 + lVar19) =
               *(float *)((long)pfVar11 + lVar19) + *(float *)((long)pfVar15 + lVar19);
          lVar19 = lVar19 + 4;
        } while (lVar18 * 4 - lVar19 != 0);
        pfVar15 = (float *)((long)pfVar15 + lVar19);
      }
    }
    if (iVar7 < iVar9) {
      pfVar11 = this->x_;
      lVar19 = 0;
      do {
        pfVar15[lVar19] = pfVar11[lVar18 + lVar19];
        lVar19 = lVar19 + 1;
      } while (iVar9 - lVar18 != lVar19);
    }
    pfVar15 = pfVar17 + this->fft_size_by2_;
    if (0 < iVar7) {
      pfVar11 = this->y_;
      lVar19 = (long)iVar9;
      do {
        *pfVar15 = pfVar11[lVar19] + *pfVar15;
        pfVar15 = pfVar15 + 1;
        lVar19 = lVar19 + 1;
      } while (lVar19 < lVar10);
      if (0 < iVar7) {
        pfVar11 = this->y_;
        lVar19 = 0;
        do {
          *(float *)((long)pfVar15 + lVar19) =
               *(float *)((long)pfVar11 + lVar19) + *(float *)((long)pfVar15 + lVar19);
          lVar19 = lVar19 + 4;
        } while (lVar18 * 4 - lVar19 != 0);
        pfVar15 = (float *)((long)pfVar15 + lVar19);
      }
    }
    if (iVar7 < iVar9) {
      pfVar11 = this->y_;
      lVar19 = 0;
      do {
        pfVar15[lVar19] = pfVar11[lVar18 + lVar19];
        lVar19 = lVar19 + 1;
      } while (iVar9 - lVar18 != lVar19);
    }
    iVar22 = iVar22 + 1;
    pfVar17 = pfVar17 + lVar10;
  } while (iVar22 != iVar12);
  psVar5 = this->input_buffer_;
  psVar13 = this->leftovers_;
LAB_00113414:
  iVar7 = (int)((ulong)((long)psVar21 - (long)psVar5) >> 1);
  iVar22 = n_input - iVar7;
  this->left_over_ = iVar22;
  if (iVar22 != 0) {
    lVar10 = 0;
    do {
      psVar13[lVar10] = psVar21[lVar10];
      lVar10 = lVar10 + 1;
    } while (iVar22 != (int)lVar10);
    if ((this->filter_state_ & 2) != 0) {
      if (iVar4 != iVar22) {
        memset(psVar13 + iVar22,0,(ulong)(uint)(~n_input + iVar4 + iVar7) * 2 + 2);
      }
      iVar4 = this->fft_size_by2_;
      pfVar15 = this->x_;
      pfVar11 = this->y_;
      pfVar14 = pfVar11;
      pfVar16 = pfVar15;
      iVar22 = iVar4;
      if ((long)iVar4 != 0) {
        do {
          *pfVar16 = (float)(int)*psVar13;
          psVar5 = psVar13 + iVar4;
          psVar13 = psVar13 + 1;
          pfVar16 = pfVar16 + 1;
          *pfVar14 = (float)(int)*psVar5;
          pfVar14 = pfVar14 + 1;
          iVar22 = iVar22 + -1;
        } while (iVar22 != 0);
        if (iVar4 != 0) {
          lVar10 = 0;
          do {
            pfVar14[lVar10] = 0.0;
            pfVar16[lVar10] = 0.0;
            lVar10 = lVar10 + 1;
          } while (iVar4 != (int)lVar10);
        }
      }
      FFT::fft(this->fft_,pfVar15,pfVar11);
      iVar4 = this->fft_size_;
      pfVar15 = this->x_;
      pfVar11 = this->y_;
      if (iVar4 != 0) {
        pfVar14 = this->xf_;
        lVar10 = 0;
        do {
          fVar23 = pfVar14[lVar10];
          fVar24 = pfVar15[lVar10];
          pfVar11[lVar10] = fVar23 * pfVar11[lVar10];
          pfVar15[lVar10] = fVar24 * fVar23;
          lVar10 = lVar10 + 1;
        } while (iVar4 != (int)lVar10);
      }
      FFT::ifft(this->fft_,pfVar15,pfVar11);
      iVar4 = this->fft_size_;
      iVar22 = this->n_filter_coeffs_by2_;
      lVar10 = (long)iVar22;
      iVar7 = iVar4 - iVar22;
      pfVar15 = pfVar17;
      if (0 < lVar10) {
        pfVar11 = this->x_;
        lVar18 = (long)iVar7;
        do {
          *pfVar15 = pfVar11[lVar18] + *pfVar15;
          pfVar15 = pfVar15 + 1;
          lVar18 = lVar18 + 1;
        } while (lVar18 < iVar4);
        if (0 < iVar22) {
          pfVar11 = this->x_;
          lVar18 = 0;
          do {
            *(float *)((long)pfVar15 + lVar18) =
                 *(float *)((long)pfVar11 + lVar18) + *(float *)((long)pfVar15 + lVar18);
            lVar18 = lVar18 + 4;
          } while (lVar10 * 4 - lVar18 != 0);
          pfVar15 = (float *)((long)pfVar15 + lVar18);
        }
      }
      if (iVar22 < iVar7) {
        pfVar11 = this->x_;
        lVar18 = 0;
        do {
          pfVar15[lVar18] = pfVar11[lVar10 + lVar18];
          lVar18 = lVar18 + 1;
        } while (iVar7 - lVar10 != lVar18);
      }
      pfVar17 = pfVar17 + this->fft_size_by2_;
      if (0 < iVar22) {
        pfVar15 = this->y_;
        lVar18 = (long)iVar7;
        do {
          *pfVar17 = pfVar15[lVar18] + *pfVar17;
          pfVar17 = pfVar17 + 1;
          lVar18 = lVar18 + 1;
        } while (lVar18 < iVar4);
        if (0 < iVar22) {
          pfVar15 = this->y_;
          lVar18 = 0;
          do {
            *(float *)((long)pfVar17 + lVar18) =
                 *(float *)((long)pfVar15 + lVar18) + *(float *)((long)pfVar17 + lVar18);
            lVar18 = lVar18 + 4;
          } while (lVar10 * 4 - lVar18 != 0);
          pfVar17 = (float *)((long)pfVar17 + lVar18);
        }
      }
      if (iVar22 < iVar7) {
        pfVar15 = this->y_;
        lVar18 = 0;
        do {
          pfVar17[lVar18] = pfVar15[lVar10 + lVar18];
          lVar18 = lVar18 + 1;
        } while (iVar7 - lVar10 != lVar18);
      }
    }
  }
  uVar8 = this->n_filter_coeffs_by2_ + this->left_over_ & (this->filter_state_ << 0x1e) >> 0x1f;
  iVar9 = iVar4 * iVar12 -
          ((-(this->filter_state_ & 1U) & this->n_filter_coeffs_by2_) + this->to_skip_);
  iVar22 = (int)(iVar9 + uVar8 + -1) / this->decimate_;
  iVar7 = iVar22 + 1;
  *n_output = iVar7;
  pfVar17 = this->output_delayed_;
  iVar4 = this->decimate_;
  if (iVar7 != 0) {
    piVar3 = this->output_buffer_;
    piVar20 = &this->n_filter_coeffs_by2_;
    if ((this->filter_state_ & 1) == 0) {
      piVar20 = &this->to_skip_;
    }
    pfVar15 = pfVar17 + *piVar20;
    lVar10 = 0;
    do {
      fVar23 = 32767.0;
      if (*pfVar15 <= 32767.0) {
        fVar23 = *pfVar15;
      }
      fVar24 = -32768.0;
      if (-32768.0 <= fVar23) {
        fVar24 = fVar23;
      }
      piVar3[lVar10] =
           (int16_t)(int)(fVar24 + *(float *)(&DAT_0012c238 + (ulong)(0.0 < fVar24) * 4));
      lVar10 = lVar10 + 1;
      pfVar15 = pfVar15 + iVar4;
    } while (iVar22 + 1 != (int)lVar10);
  }
  iVar22 = this->n_filter_coeffs_;
  if (iVar22 != 0) {
    iVar2 = this->fft_size_;
    do {
      *pfVar17 = pfVar17[iVar12 * iVar2];
      pfVar17 = pfVar17 + 1;
      iVar22 = iVar22 + -1;
    } while (iVar22 != 0);
  }
  this->to_skip_ = iVar4 * iVar7 - (iVar9 + uVar8);
  return;
}

Assistant:

void FdFilter::FilterBuffer(int n_input, int *n_output) {
  int16_t *p, *r, *p2;
  float *dp1, *dp2, *q, half = 0.5;
  int  i, j, k, npass;
  int totaln;

  if (filter_state_ & 1) {  /* first call with this signal and filter? */
    first_out_ = 0;
    to_skip_ = 0;
    left_over_ = 0;
    for (i = max_input_+n_filter_coeffs_, q = output_delayed_; i--;)
      *q++ = 0.0;
  }    /* end of once-per-filter-invocation initialization */

  npass = (n_input + left_over_) / fft_size_;
  if (!npass && (filter_state_ & 2)) {  // if it's the end...
    // Append the input to the leftovers, then pad with zeros.
    p = input_buffer_;
    for (p = input_buffer_, r = leftovers_ + left_over_, i = n_input; i--;) {
      *r++ = *p++; /* append to leftovers_ from prev. call */
    }
    int to_pad = fft_size_ - (left_over_ + n_input);
    for (int i = 0; i < to_pad; ++i) {
      *r++ = 0;
    }
    npass = 1;
  } else {
    /* This is the normal non-boundary course of action. */
    for (p = input_buffer_, r = leftovers_ + left_over_,
           i = fft_size_ - left_over_; i--;)
      *r++ = *p++; /* append to leftovers_ from prev. call */
  }
  if (!npass && !(filter_state_ & 2)) {  // it's not the end, but don't
                                       // have enough data for a loop.
    left_over_ += n_input;
    *n_output = 0;
    first_out_ |= filter_state_ & 1;  // flag that start of sig is still here.
    return;
  }
  filter_state_ |= first_out_;
  first_out_ = 0;

  /* >>>>>>>>>>>>>> Here's the main processing loop. <<<<<<<<<<<<< */
  for (/* p set up above */ q = output_delayed_, i = 0; i < npass;
                            i++, q += fft_size_) {
    if (i) {
      for (r = p + fft_size_by2_, j = fft_size_by2_, dp1 = x_, dp2 = y_; j--;) {
        *dp1++ = *p++;
        *dp2++ = *r++;
      }
      p += fft_size_by2_;
    } else {
      for (p2 = leftovers_, r = p2 + fft_size_by2_, j = fft_size_by2_,
             dp1 = x_, dp2 = y_; j--;) {
        *dp1++ = *p2++;
        *dp2++ = *r++;
      }
    }
    for (j = fft_size_by2_; j--;)
      *dp1++ = *dp2++ = 0.0;

    /* Filtering is done in the frequency domain; transform two real arrays. */
    fft_->fft(x_, y_);
    ComplexDotProduct(fft_size_, x_, y_, xf_, NULL, x_, y_);
    fft_->ifft(x_, y_);

    /* Overlap and add. */
    for (dp2 = q, j = fft_size_ - n_filter_coeffs_by2_; j < fft_size_; j++)
      *dp2++ += x_[j];
    for (j = 0, k = n_filter_coeffs_by2_; j < k; j++)
      *dp2++ += x_[j];
    for (j = n_filter_coeffs_by2_, k = fft_size_ - n_filter_coeffs_by2_;
         j < k; j++)
      *dp2++ = x_[j];

    for (dp2 = q+fft_size_by2_, j = fft_size_ - n_filter_coeffs_by2_;
         j < fft_size_; j++)
      *dp2++ += y_[j];
    for (j = 0, k = n_filter_coeffs_by2_; j < k; j++)
      *dp2++ += y_[j];
    for (j = n_filter_coeffs_by2_, k = fft_size_ - n_filter_coeffs_by2_;
         j < k; j++)
      *dp2++ = y_[j];
  }    /* end of main processing loop */

  left_over_ = n_input - (p-input_buffer_);
  for (i = left_over_, r = leftovers_; i--;)  // Save unused input
                                              // samples for next call.
    *r++ = *p++;
  /* If signal end is here, must process any unused input. */
  if (left_over_ && (filter_state_ & 2)) {  // Must do one more zero-pad pass.
    for (p2 = leftovers_ + left_over_, i = fft_size_ - left_over_; i--;)
      *p2++ = 0;
    for (p2 = leftovers_, r = p2 + fft_size_by2_, j = fft_size_by2_,
           dp1 = x_, dp2 = y_; j--;) {
      *dp1++ = *p2++;
      *dp2++ = *r++;
    }
    for (j = fft_size_by2_; j--;)
      *dp1++ = *dp2++ = 0.0;
    /* Filtering is done in the frequency domain; transform two real arrays. */
    fft_->fft(x_, y_);
    ComplexDotProduct(fft_size_, x_, y_, xf_, NULL, x_, y_);
    fft_->ifft(x_, y_);

    /* Overlap and add. */
    for (dp2 = q, j = fft_size_ - n_filter_coeffs_by2_; j < fft_size_; j++)
      *dp2++ += x_[j];
    for (j = 0, k = n_filter_coeffs_by2_; j < k; j++)
      *dp2++ += x_[j];
    for (j = n_filter_coeffs_by2_, k = fft_size_ - n_filter_coeffs_by2_;
         j < k; j++)
      *dp2++ = x_[j];

    for (dp2 = q+fft_size_by2_, j = fft_size_ - n_filter_coeffs_by2_;
         j < fft_size_; j++)
      *dp2++ += y_[j];
    for (j = 0, k = n_filter_coeffs_by2_; j < k; j++)
      *dp2++ += y_[j];
    for (j = n_filter_coeffs_by2_, k = fft_size_ - n_filter_coeffs_by2_;
         j < k; j++)
      *dp2++ = y_[j];
  }
  /* total good output samples in ob: */
  totaln = (((npass * fft_size_) - to_skip_ -
             ((1 & filter_state_)? n_filter_coeffs_by2_ : 0)) +
            ((filter_state_ & 2)? left_over_ + n_filter_coeffs_by2_ : 0));
  /* number returned to caller: */
  *n_output = 1 + (totaln - 1) / decimate_;  // possible decimation for
                                           // downsampling
  /* Round, decimate and output the samples. */
  float f_temp;
  q = (filter_state_ & 1)? output_delayed_ + (n_filter_coeffs_by2_) :
                                output_delayed_ + to_skip_;
  for (j = decimate_, i =  *n_output, p = output_buffer_; i-- ; q += j) {
    if ((f_temp = *q) > 32767.0)
      f_temp = 32767.0;
    if (f_temp < -32768.0)
      f_temp = -32768.0;
    *p++ = static_cast<int16_t>((f_temp > 0.0) ? half + f_temp : f_temp - half);
  }

  for (dp1 = output_delayed_ + npass*fft_size_, j = n_filter_coeffs_,
         dp2 = output_delayed_; j--;) /*save mem for next call */
    *dp2++ = *dp1++;
  /* If decimating, number to skip on next call. */
  to_skip_ = (*n_output * decimate_) - totaln;
}